

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThanEquals,true,false,false,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int64_t *piVar7;
  sel_t sVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  interval_t *input;
  
  if (count + 0x3f < 0x40) {
    lVar10 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar10 = 0;
    uVar5 = 0;
    uVar15 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = 0xffffffffffffffff;
      }
      else {
        uVar6 = puVar1[uVar5];
      }
      uVar4 = uVar15 + 0x40;
      if (count <= uVar15 + 0x40) {
        uVar4 = count;
      }
      uVar16 = uVar15;
      if (uVar6 == 0xffffffffffffffff) {
        if (uVar15 < uVar4) {
          lVar13 = ldata->micros;
          psVar2 = sel->sel_vector;
          lVar9 = (long)ldata->days + lVar13 / 86400000000;
          lVar14 = lVar9 % 0x1e;
          lVar9 = (long)ldata->months + lVar9 / 0x1e;
          psVar3 = false_sel->sel_vector;
          piVar7 = &rdata[uVar15].micros;
          do {
            uVar6 = uVar15;
            if (psVar2 != (sel_t *)0x0) {
              uVar6 = (ulong)psVar2[uVar15];
            }
            lVar12 = (long)*(int32_t *)((long)piVar7 + -4) + *piVar7 / 86400000000;
            lVar17 = lVar12 % 0x1e;
            lVar12 = (long)((interval_t *)(piVar7 + -1))->months + lVar12 / 0x1e;
            uVar16 = 1;
            if (lVar12 <= lVar9) {
              if (lVar12 < lVar9) {
                uVar16 = 0;
              }
              else if (lVar17 <= lVar14) {
                uVar16 = (ulong)(lVar13 % 86400000000 < *piVar7 % 86400000000 && lVar14 <= lVar17);
              }
            }
            psVar3[lVar10] = (sel_t)uVar6;
            lVar10 = lVar10 + uVar16;
            uVar15 = uVar15 + 1;
            piVar7 = piVar7 + 2;
            uVar16 = uVar15;
          } while (uVar4 != uVar15);
        }
      }
      else if (uVar6 == 0) {
        uVar16 = uVar4;
        if (uVar15 < uVar4) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            sVar8 = (sel_t)uVar15;
            if (psVar2 != (sel_t *)0x0) {
              sVar8 = psVar2[uVar15];
            }
            psVar3[lVar10] = sVar8;
            lVar10 = lVar10 + 1;
            uVar15 = uVar15 + 1;
          } while (uVar4 != uVar15);
        }
      }
      else if (uVar15 < uVar4) {
        psVar2 = sel->sel_vector;
        psVar3 = false_sel->sel_vector;
        piVar7 = &rdata[uVar15].micros;
        uVar16 = 0;
        do {
          if (psVar2 == (sel_t *)0x0) {
            sVar8 = (int)uVar15 + (int)uVar16;
          }
          else {
            sVar8 = psVar2[uVar15 + uVar16];
          }
          uVar11 = 1;
          if ((uVar6 >> (uVar16 & 0x3f) & 1) != 0) {
            lVar13 = (long)*(int32_t *)((long)piVar7 + -4) + *piVar7 / 86400000000;
            lVar9 = lVar13 % 0x1e;
            lVar17 = (long)((interval_t *)(piVar7 + -1))->months + lVar13 / 0x1e;
            lVar14 = (long)ldata->days + ldata->micros / 86400000000;
            lVar13 = lVar14 % 0x1e;
            lVar14 = (long)ldata->months + lVar14 / 0x1e;
            if (lVar17 <= lVar14) {
              if (lVar17 < lVar14) {
                uVar11 = 0;
              }
              else if (lVar9 <= lVar13) {
                uVar11 = (ulong)(ldata->micros % 86400000000 < *piVar7 % 86400000000 &&
                                lVar13 <= lVar9);
              }
            }
          }
          psVar3[lVar10] = sVar8;
          lVar10 = uVar11 + lVar10;
          uVar16 = uVar16 + 1;
          piVar7 = piVar7 + 2;
        } while ((uVar15 - uVar4) + uVar16 != 0);
        uVar16 = uVar15 + uVar16;
      }
      uVar5 = uVar5 + 1;
      uVar15 = uVar16;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return count - lVar10;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}